

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_connection.cpp
# Opt level: O0

int __thiscall cpp_db::sqlite_connection::open(sqlite_connection *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int error;
  int extraout_EAX;
  db_exception *this_00;
  char *pcVar2;
  sqlite_exception *this_01;
  undefined8 in_RCX;
  sqlite3 *psStack_68;
  int error_code;
  sqlite3 *dbptr;
  allocator<char> local_49;
  string local_48;
  undefined8 local_28;
  key_value_pair *param_4_local;
  authentication *param_3_local;
  string *database_local;
  sqlite_connection *this_local;
  
  local_28 = in_RCX;
  param_4_local = ___oflag;
  param_3_local = (authentication *)__file;
  database_local = (string *)this;
  uVar1 = (*(this->super_connection_interface)._vptr_connection_interface[4])();
  if ((uVar1 & 1) != 0) {
    dbptr._3_1_ = 1;
    this_00 = (db_exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Database already open",&local_49);
    db_exception::db_exception(this_00,&local_48);
    dbptr._3_1_ = 0;
    __cxa_throw(this_00,&db_exception::typeinfo,db_exception::~db_exception);
  }
  psStack_68 = (sqlite3 *)0x0;
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      param_3_local);
  error = sqlite3_open_v2(pcVar2,&stack0xffffffffffffff98,6,0);
  if (error != 0) {
    this_01 = (sqlite_exception *)__cxa_allocate_exception(0x18);
    sqlite_exception::sqlite_exception(this_01,error,psStack_68);
    __cxa_throw(this_01,&sqlite_exception::typeinfo,sqlite_exception::~sqlite_exception);
  }
  std::__shared_ptr<sqlite3,(__gnu_cxx::_Lock_policy)2>::
  reset<sqlite3,cpp_db::sqlite_connection::open(std::__cxx11::string_const&,cpp_db::authentication_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>
            ((__shared_ptr<sqlite3,(__gnu_cxx::_Lock_policy)2> *)&this->db,psStack_68);
  return extraout_EAX;
}

Assistant:

void sqlite_connection::open(const std::string &database, const authentication &, const key_value_pair &)
{
    if (is_open())
        throw db_exception("Database already open");

    sqlite3 *dbptr(nullptr);
    if (int error_code = sqlite3_open_v2(database.c_str(), &dbptr, SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, nullptr))
        throw sqlite_exception(error_code, dbptr);
    db.reset(dbptr, [](sqlite3 *db)
    {
        if (int error_code = sqlite3_close(db))
            throw sqlite_exception(error_code, db);
    }
    );
}